

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<char[1]>(XmlWriter *this,string *name,char (*attribute) [1])

{
  XmlWriter *pXVar1;
  ReusableStringStream *in_RDI;
  long in_FS_OFFSET;
  ReusableStringStream rss;
  ReusableStringStream *in_stack_ffffffffffffff68;
  ReusableStringStream *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  XmlWriter *in_stack_ffffffffffffffb0;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_ffffffffffffffa0);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff70,(char (*) [1])in_stack_ffffffffffffff68);
  ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff68);
  pXVar1 = writeAttribute(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_28);
  ReusableStringStream::~ReusableStringStream(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pXVar1;
  }
  __stack_chk_fail();
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }